

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall llvm::FoldingSetNodeID::AddNodeID(FoldingSetNodeID *this,FoldingSetNodeID *ID)

{
  uint *in_start;
  void *pvVar1;
  size_t sVar2;
  FoldingSetNodeID *ID_local;
  FoldingSetNodeID *this_local;
  
  in_start = (uint *)(ID->Bits).super_SmallVectorImpl<unsigned_int>.
                     super_SmallVectorTemplateBase<unsigned_int,_true>.
                     super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.
                     BeginX;
  pvVar1 = (ID->Bits).super_SmallVectorImpl<unsigned_int>.
           super_SmallVectorTemplateBase<unsigned_int,_true>.
           super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)ID);
  SmallVectorImpl<unsigned_int>::append<unsigned_int_const*,void>
            ((SmallVectorImpl<unsigned_int> *)this,in_start,(uint *)((long)pvVar1 + sVar2 * 4));
  return;
}

Assistant:

void FoldingSetNodeID::AddNodeID(const FoldingSetNodeID &ID) {
  Bits.append(ID.Bits.begin(), ID.Bits.end());
}